

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::ComputeCoarseStiffness
          (TPZDohrSubstruct<std::complex<float>_> *this)

{
  int iVar1;
  long lVar2;
  int64_t newRows;
  TPZMatrix<std::complex<float>_> *pTVar3;
  complex<float> *__s;
  complex<float> in_R9;
  ulong uVar4;
  TPZFMatrix<std::complex<float>_> temp1;
  int in_stack_ffffffffffffff38;
  TPZFMatrix<std::complex<float>_> local_c0;
  
  iVar1 = this->fNEquations;
  lVar2 = (this->fCoarseIndex).fNElements;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  local_c0.fElem = (complex<float> *)0x0;
  local_c0.fGiven = (complex<float> *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = (long)iVar1;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar2;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
  local_c0.fWork.fStore = (complex<float> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar4 = lVar2 * iVar1;
  if (uVar4 != 0) {
    __s = (complex<float> *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    memset(__s,0,uVar4 * 8);
    local_c0.fElem = __s;
  }
  newRows = (this->fCoarseIndex).fNElements;
  TPZFMatrix<std::complex<float>_>::Resize(&this->fKCi,newRows,newRows);
  pTVar3 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar3,&this->fPhiC,&local_c0,0);
  TPZFMatrix<std::complex<float>_>::MultAdd
            (&this->fPhiC,&local_c0,&local_c0,&this->fKCi,(complex<float>)0x1,in_R9,
             in_stack_ffffffffffffff38);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeCoarseStiffness() {
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	fKCi.Resize(fCoarseIndex.NElements(),fCoarseIndex.NElements());
	fStiffness->Multiply(fPhiC,temp1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		temp1.Print("stiffness matrix times phi",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fPhiC.MultAdd(temp1,temp1,fKCi,1,0,1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		fKCi.Print("Coarse stiffness matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}